

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

Vec_Int_t * Mf_ManDeriveCnfs(Mf_Man_t *p,int *pnVars,int *pnClas,int *pnLits)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  word *pwVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  Gia_Man_t *p_02;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int pCnf [512];
  
  p_00 = Vec_IntStart((p->vCnfSizes).nSize);
  p_01 = Vec_IntAlloc((p->vCnfSizes).nSize * 3);
  Vec_IntFill(p_01,(p->vCnfSizes).nSize,-1);
  if (8 < p->pPars->nLutSize) {
    __assert_fail("p->pPars->nLutSize <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                  ,0x114,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
  }
  for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
    iVar3 = p->pPars->nLutSize;
    pwVar5 = Vec_MemReadEntry(p->vTtMem,iVar10);
    if (iVar3 < 7) {
      uVar2 = Abc_Tt6Cnf(*pwVar5,iVar10,pCnf);
    }
    else {
      uVar2 = Abc_Tt8Cnf(pwVar5,iVar10,pCnf);
    }
    iVar3 = Mf_ManCountLits(pCnf,uVar2,iVar10);
    Vec_IntWriteEntry(p_00,iVar10,iVar3);
    Vec_IntWriteEntry(p_01,iVar10,p_01->nSize);
    Vec_IntPush(p_01,uVar2);
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      Vec_IntPush(p_01,pCnf[uVar8]);
    }
  }
  p_02 = p->pGia;
  pVVar1 = p_02->vCos;
  *pnVars = p_02->vCis->nSize + 1 + pVVar1->nSize;
  *pnClas = pVVar1->nSize * 2 + 1;
  *pnLits = pVVar1->nSize * 4 + 1;
  lVar9 = 0;
  do {
    if (p_02->nObjs <= lVar9) {
      Vec_IntFree(p_00);
      return p_01;
    }
    pGVar6 = Gia_ManObj(p_02,(int)lVar9);
    if (((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) &&
       (0xffff < *(uint *)&p->pLfObjs[lVar9].field_0xc)) {
      piVar7 = Mf_ObjCutSet(p,(int)lVar9);
      iVar10 = Abc_Lit2Var((uint)piVar7[1] >> 5);
      iVar3 = Vec_IntEntry(p_01,iVar10);
      if (iVar3 == -1) {
        iVar3 = p->pPars->nLutSize;
        pwVar5 = Vec_MemReadEntry(p->vTtMem,iVar10);
        if (iVar3 < 7) {
          uVar2 = Abc_Tt6Cnf(*pwVar5,piVar7[1] & 0x1f,pCnf);
        }
        else {
          uVar2 = Abc_Tt8Cnf(pwVar5,piVar7[1] & 0x1f,pCnf);
        }
        uVar4 = Vec_IntEntry(&p->vCnfSizes,iVar10);
        if (uVar2 != uVar4) {
          __assert_fail("nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                        ,0x134,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
        }
        iVar3 = Mf_ManCountLits(pCnf,uVar2,piVar7[1] & 0x1f);
        Vec_IntWriteEntry(p_00,iVar10,iVar3);
        Vec_IntWriteEntry(p_01,iVar10,p_01->nSize);
        Vec_IntPush(p_01,uVar2);
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
          Vec_IntPush(p_01,pCnf[uVar8]);
        }
      }
      *pnVars = *pnVars + 1;
      iVar3 = Vec_IntEntry(&p->vCnfSizes,iVar10);
      *pnClas = *pnClas + iVar3;
      iVar10 = Vec_IntEntry(p_00,iVar10);
      *pnLits = *pnLits + iVar10;
    }
    lVar9 = lVar9 + 1;
    p_02 = p->pGia;
  } while( true );
}

Assistant:

Vec_Int_t * Mf_ManDeriveCnfs( Mf_Man_t * p, int * pnVars, int * pnClas, int * pnLits )
{
    int i, k, iFunc, nCubes, nLits, * pCut, pCnf[512];
    Vec_Int_t * vLits = Vec_IntStart( Vec_IntSize(&p->vCnfSizes) );
    Vec_Int_t * vCnfs = Vec_IntAlloc( 3 * Vec_IntSize(&p->vCnfSizes) );
    Vec_IntFill( vCnfs, Vec_IntSize(&p->vCnfSizes), -1 );
    assert( p->pPars->nLutSize <= 8 );
    // constant/buffer
    for ( iFunc = 0; iFunc < 2; iFunc++ )
    {
        if ( p->pPars->nLutSize <= 6 )
            nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        else
            nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        nLits = Mf_ManCountLits( pCnf, nCubes, iFunc );
        Vec_IntWriteEntry( vLits, iFunc, nLits );
        Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
        Vec_IntPush( vCnfs, nCubes );
        for ( k = 0; k < nCubes; k++ )
            Vec_IntPush( vCnfs, pCnf[k] );
    }
    // other functions
    *pnVars = 1 + Gia_ManCiNum(p->pGia) + Gia_ManCoNum(p->pGia);
    *pnClas = 1 + 2 * Gia_ManCoNum(p->pGia);
    *pnLits = 1 + 4 * Gia_ManCoNum(p->pGia);
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        //Mf_CutPrintOne( pCut );
        iFunc = Abc_Lit2Var( Mf_CutFunc(pCut) );
        if ( Vec_IntEntry(vCnfs, iFunc) == -1 )
        {
            if ( p->pPars->nLutSize <= 6 )
                nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            else
                nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            assert( nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc) );
            nLits = Mf_ManCountLits( pCnf, nCubes, Mf_CutSize(pCut) );
            // save CNF
            Vec_IntWriteEntry( vLits, iFunc, nLits );
            Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
            Vec_IntPush( vCnfs, nCubes );
            for ( k = 0; k < nCubes; k++ )
                Vec_IntPush( vCnfs, pCnf[k] );
        }
        *pnVars += 1;
        *pnClas += Vec_IntEntry(&p->vCnfSizes, iFunc);
        *pnLits += Vec_IntEntry(vLits, iFunc);
    }
    Vec_IntFree( vLits );
    return vCnfs;
}